

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event.cpp
# Opt level: O3

void __thiscall cppnet::TimerEvent::OnTimer(TimerEvent *this)

{
  int iVar1;
  ushort uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var3;
  SingletonLogger *this_01;
  long *plVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_RBX;
  bool bVar6;
  void *local_20;
  
  uVar2 = (this->super_Event)._event_type;
  if ((uVar2 & 0x10) != 0) {
    local_20 = (this->super_Event)._data;
    if ((this->_timer_cb).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
      _Unwind_Resume(uVar5);
    }
    (*(this->_timer_cb)._M_invoker)((_Any_data *)&this->_timer_cb,&local_20);
    return;
  }
  if ((uVar2 & 8) != 0) {
    this_00 = (this->super_Event)._socket.
              super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var3 = this_00->_M_use_count;
    do {
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = _Var3 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = _Var3 + 1;
        iVar1 = _Var3;
      }
      _Var3 = iVar1;
      UNLOCK();
    } while (!bVar6);
    iVar1 = this_00->_M_use_count;
    plVar4 = (long *)__dynamic_cast((this->super_Event)._socket.
                                    super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,&Socket::typeinfo,&RWSocket::typeinfo,0);
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = iVar1 + 1;
    }
    (**(code **)(*plVar4 + 0x68))(plVar4);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  this_01 = Singleton<cppnet::SingletonLogger>::Instance();
  SingletonLogger::Error
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/timer_event.cpp"
             ,0x1b,"invalid timer type. type:%d",(ulong)(this->super_Event)._event_type);
  return;
}

Assistant:

void TimerEvent::OnTimer() {
    if (GetType() & ET_USER_TIMER) {
        _timer_cb(GetData());

    } else if (GetType() & ET_TIMER) {
        auto sock = GetSocket();
        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        rw_sock->OnTimer();

    } else {
        LOG_ERROR("invalid timer type. type:%d", GetType());
    }
}